

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

bool __thiscall duckdb::LogicalType::IsJSONType(LogicalType *this)

{
  bool bVar1;
  int iVar2;
  string local_30;
  
  if ((this->id_ == VARCHAR) && (bVar1 = HasAlias(this), bVar1)) {
    GetAlias_abi_cxx11_(&local_30,this);
    iVar2 = ::std::__cxx11::string::compare((char *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return iVar2 == 0;
    }
    operator_delete(local_30._M_dataplus._M_p);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

bool LogicalType::IsJSONType() const {
	return id() == LogicalTypeId::VARCHAR && HasAlias() && GetAlias() == JSON_TYPE_NAME;
}